

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

vector<P_*,_std::allocator<P_*>_> * __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
          (vector<P_*,_std::allocator<P_*>_> *__return_storage_ptr__,
          KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node,P *searchMin,P *searchMax,
          P *currentRegionMin,P *currentRegionMax,uint depth)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  P_delete local_11c;
  P_delete local_11b;
  P_delete local_11a;
  P_delete local_119;
  P **local_118;
  P **local_110;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_108;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_100;
  const_iterator local_f8;
  undefined1 local_f0 [8];
  vector<P_*,_std::allocator<P_*>_> resultRight;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_c0;
  const_iterator local_b8;
  undefined1 local_b0 [8];
  vector<P_*,_std::allocator<P_*>_> resultLeft;
  uint local_90;
  P_new local_89;
  int i;
  P *rightRegionMax;
  P *local_78;
  P *rightRegionMin;
  P *local_68;
  P *leftRegionMax;
  P *local_58;
  P *leftRegionMin;
  undefined1 local_39;
  P *local_38;
  P *currentRegionMin_local;
  P *searchMax_local;
  P *searchMin_local;
  Node *node_local;
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this_local;
  vector<P_*,_std::allocator<P_*>_> *result;
  
  local_39 = 0;
  local_38 = currentRegionMin;
  currentRegionMin_local = searchMax;
  searchMax_local = searchMin;
  searchMin_local = (P *)node;
  node_local = (Node *)this;
  this_local = (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)__return_storage_ptr__;
  std::vector<P_*,_std::allocator<P_*>_>::vector(__return_storage_ptr__);
  if (*(long *)searchMin_local == 0) {
    bVar1 = nodeInSearchRange(this,searchMax_local,currentRegionMin_local,(Node *)searchMin_local);
    if (bVar1) {
      std::vector<P_*,_std::allocator<P_*>_>::push_back
                (__return_storage_ptr__,(value_type *)&searchMin_local->d2);
    }
  }
  else {
    local_58 = P_new::operator()((P_new *)((long)&leftRegionMax + 7));
    local_68 = P_new::operator()((P_new *)((long)&rightRegionMin + 7));
    local_78 = P_new::operator()((P_new *)((long)&rightRegionMax + 7));
    _i = P_new::operator()(&local_89);
    for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
      P_set::operator()((P_set *)((long)&resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                        local_58,local_38,local_90);
      P_set::operator()((P_set *)((long)&resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                        local_68,currentRegionMax,local_90);
      P_set::operator()((P_set *)((long)&resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage + 5),
                        local_78,local_38,local_90);
      P_set::operator()((P_set *)((long)&resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),_i,
                        currentRegionMax,local_90);
    }
    P_set::operator()((P_set *)((long)&resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                      local_68,*(P **)&searchMin_local->d2,depth % 3);
    P_set::operator()((P_set *)((long)&resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                      local_78,*(P **)&searchMin_local->d2,depth % 3);
    bVar1 = regionContained(this,searchMax_local,currentRegionMin_local,local_58,local_68);
    if (bVar1) {
      reportSubtree(this,*(Node **)searchMin_local,__return_storage_ptr__);
    }
    else {
      bVar1 = regionIntersects(this,searchMax_local,currentRegionMin_local,local_58,local_68);
      if (bVar1) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_b0,this,*(Node **)searchMin_local,
                       searchMax_local,currentRegionMin_local,local_58,local_68,depth + 1);
        local_c0._M_current =
             (P **)std::vector<P_*,_std::allocator<P_*>_>::end(__return_storage_ptr__);
        __gnu_cxx::__normal_iterator<P*const*,std::vector<P*,std::allocator<P*>>>::
        __normal_iterator<P**>
                  ((__normal_iterator<P*const*,std::vector<P*,std::allocator<P*>>> *)&local_b8,
                   &local_c0);
        __first = std::vector<P_*,_std::allocator<P_*>_>::begin
                            ((vector<P_*,_std::allocator<P_*>_> *)local_b0);
        __last = std::vector<P_*,_std::allocator<P_*>_>::end
                           ((vector<P_*,_std::allocator<P_*>_> *)local_b0);
        resultRight.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)std::vector<P*,std::allocator<P*>>::
                      insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
                                ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,local_b8,
                                 (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
                                 __first._M_current,
                                 (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
                                 __last._M_current);
        std::vector<P_*,_std::allocator<P_*>_>::~vector
                  ((vector<P_*,_std::allocator<P_*>_> *)local_b0);
      }
    }
    bVar1 = regionContained(this,searchMax_local,currentRegionMin_local,local_78,_i);
    if (bVar1) {
      reportSubtree(this,(Node *)searchMin_local->d1,__return_storage_ptr__);
    }
    else {
      bVar1 = regionIntersects(this,searchMax_local,currentRegionMin_local,local_78,_i);
      if (bVar1) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_f0,this,
                       (Node *)searchMin_local->d1,searchMax_local,currentRegionMin_local,local_78,
                       _i,depth + 1);
        local_100._M_current =
             (P **)std::vector<P_*,_std::allocator<P_*>_>::end(__return_storage_ptr__);
        __gnu_cxx::__normal_iterator<P*const*,std::vector<P*,std::allocator<P*>>>::
        __normal_iterator<P**>
                  ((__normal_iterator<P*const*,std::vector<P*,std::allocator<P*>>> *)&local_f8,
                   &local_100);
        local_108._M_current =
             (P **)std::vector<P_*,_std::allocator<P_*>_>::begin
                             ((vector<P_*,_std::allocator<P_*>_> *)local_f0);
        local_110 = (P **)std::vector<P_*,_std::allocator<P_*>_>::end
                                    ((vector<P_*,_std::allocator<P_*>_> *)local_f0);
        local_118 = (P **)std::vector<P*,std::allocator<P*>>::
                          insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
                                    ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                                     local_f8,local_108,
                                     (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>
                                      )local_110);
        std::vector<P_*,_std::allocator<P_*>_>::~vector
                  ((vector<P_*,_std::allocator<P_*>_> *)local_f0);
      }
    }
    P_delete::operator()(&local_119,local_58);
    P_delete::operator()(&local_11a,local_68);
    P_delete::operator()(&local_11b,local_78);
    P_delete::operator()(&local_11c,_i);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}